

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O0

int __thiscall
TPZSkylMatrix<long_double>::Subst_Forward
          (TPZSkylMatrix<long_double> *this,TPZFMatrix<long_double> *B)

{
  bool bVar1;
  int64_t row;
  long lVar2;
  int64_t iVar3;
  longdouble *plVar4;
  longdouble **pplVar5;
  TPZFMatrix<long_double> *this_00;
  TPZBaseMatrix *in_RSI;
  long *in_RDI;
  longdouble *BPtr;
  longdouble *end_ki;
  longdouble *elem_ki;
  longdouble sum;
  int64_t k;
  int64_t j;
  int64_t dimension;
  char *in_stack_00000188;
  char *in_stack_00000190;
  TPZFMatrix<long_double> *in_stack_ffffffffffffffb0;
  longdouble *local_40;
  longdouble local_38;
  long local_28;
  long local_20;
  
  row = TPZBaseMatrix::Rows(in_RSI);
  lVar2 = (**(code **)(*in_RDI + 0x60))();
  if ((row != lVar2) || ((char)in_RDI[3] != '\x03')) {
    TPZMatrix<long_double>::Error(in_stack_00000190,in_stack_00000188);
  }
  lVar2 = (**(code **)(*in_RDI + 0x60))();
  for (local_20 = 0; iVar3 = TPZBaseMatrix::Cols(in_RSI), local_20 < iVar3; local_20 = local_20 + 1)
  {
    local_28 = 0;
    while( true ) {
      bVar1 = false;
      if (local_28 < lVar2) {
        plVar4 = TPZFMatrix<long_double>::operator()(in_stack_ffffffffffffffb0,row,(int64_t)in_RDI);
        bVar1 = (longdouble)0 == *plVar4;
      }
      if (!bVar1) break;
      local_28 = local_28 + 1;
    }
    for (; local_28 < lVar2; local_28 = local_28 + 1) {
      local_38 = (longdouble)0;
      pplVar5 = TPZVec<long_double_*>::operator[]((TPZVec<long_double_*> *)(in_RDI + 4),local_28);
      local_40 = *pplVar5;
      pplVar5 = TPZVec<long_double_*>::operator[]
                          ((TPZVec<long_double_*> *)(in_RDI + 4),local_28 + 1);
      plVar4 = *pplVar5;
      this_00 = (TPZFMatrix<long_double> *)
                TPZFMatrix<long_double>::operator()(in_stack_ffffffffffffffb0,row,(int64_t)in_RDI);
      while (local_40 = local_40 + 1, local_40 < plVar4) {
        local_38 = *local_40 * *(longdouble *)&this_00[-1].fWork.fNElements + local_38;
        this_00 = (TPZFMatrix<long_double> *)&this_00[-1].fWork.fNElements;
      }
      in_stack_ffffffffffffffb0 =
           (TPZFMatrix<long_double> *)
           TPZFMatrix<long_double>::operator()(this_00,row,(int64_t)in_RDI);
      *(longdouble *)&(in_stack_ffffffffffffffb0->super_TPZMatrix<long_double>).super_TPZBaseMatrix
           = *(longdouble *)
              &(in_stack_ffffffffffffffb0->super_TPZMatrix<long_double>).super_TPZBaseMatrix -
             local_38;
      pplVar5 = TPZVec<long_double_*>::operator[]((TPZVec<long_double_*> *)(in_RDI + 4),local_28);
      *(longdouble *)&(in_stack_ffffffffffffffb0->super_TPZMatrix<long_double>).super_TPZBaseMatrix
           = *(longdouble *)
              &(in_stack_ffffffffffffffb0->super_TPZMatrix<long_double>).super_TPZBaseMatrix /
             **pplVar5;
    }
  }
  return 1;
}

Assistant:

int
TPZSkylMatrix<TVar>::Subst_Forward( TPZFMatrix<TVar> *B ) const
{
    if ( (B->Rows() != this->Dim()) || this->fDecomposed != ECholesky)
        TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__,"TPZSkylMatrix::Subst_Forward not decomposed with cholesky");
    
#ifdef DUMP_BEFORE_SUBST
    dump_matrices(this, B, "TPZSkylMatrix::Subst_Forward(B)");
#endif
    
    //	std::cout << "SubstForward this " << (void *) this << " neq " << Dim() << " normb " << Norm(*B) << std::endl;
    int64_t dimension=this->Dim();
    for ( int64_t j = 0; j < B->Cols(); j++ )
    {
        int64_t k=0;
        while (k<dimension && (*B)(k,j) == TVar(0)) {
            k++;
        }
        //		std::cout << "kstart " << k << std::endl;
        for (; k < dimension; k++ )
        {
            // Faz sum = SOMA( A[k,i] * B[i,j] ), para i = 1, ..., k-1.
            //
            TVar sum = 0.0;
            TVar *elem_ki = fElem[k]+1;
            TVar *end_ki  = fElem[k+1];
            TVar* BPtr = &(*B)(k,j);   //(k-1,j)
            //	for ( int i = k-1; elem_ki < end_ki; i-- )
            //	  sum += (*elem_ki++) * B->GetVal( i, j );
            
            //EBORIN:
            // Is this a hot-spot?
            // Is it vectorized?
            if constexpr(is_complex<TVar>::value)
                while(elem_ki < end_ki) sum += std::conj(*elem_ki++) * (*--BPtr);//(*BPtr--)
            else
                while(elem_ki < end_ki) sum += (*elem_ki++) * (*--BPtr);//(*BPtr--)
            // Faz B[k,j] = (B[k,j] - sum) / A[k,k].
            //
            //	B->PutVal( k, j, (B->GetVal(k, j) - sum) / row_k->pElem[0] );
            BPtr = &(*B)(k,j);
            *BPtr-= sum;
            *BPtr /= fElem[k][0];
        }
    }
    
    return( 1 );
}